

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O2

void __thiscall libDAI::FactorGraph::backupFactor(FactorGraph *this,size_t I)

{
  int iVar1;
  iterator iVar2;
  undefined4 extraout_var;
  mapped_type *this_00;
  Exception *this_01;
  allocator<char> local_49;
  size_t I_local;
  string local_40;
  
  I_local = I;
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_libDAI::TFactor<double>_>,_std::_Select1st<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
          ::find(&(this->_backupFactors)._M_t,&I_local);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->_backupFactors)._M_t._M_impl.super__Rb_tree_header
     ) {
    iVar1 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[10])(this,I_local);
    this_00 = std::
              map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
              ::operator[](&this->_backupFactors,&I_local);
    TFactor<double>::operator=(this_00,(TFactor<double> *)CONCAT44(extraout_var,iVar1));
    return;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"factorgraph.cpp, line 460",&local_49);
  Exception::Exception(this_01,9,&local_40);
  __cxa_throw(this_01,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FactorGraph::backupFactor( size_t I ) {
        map<size_t,Factor>::iterator it = _backupFactors.find( I );
        if( it != _backupFactors.end() )
            DAI_THROW( MULTIPLE_UNDO );
        _backupFactors[I] = factor(I);
    }